

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

void __thiscall
TPZFMatrix<float>::CheckTypeCompatibility
          (TPZFMatrix<float> *this,TPZMatrix<float> *A,TPZMatrix<float> *B)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  
  if (A == (TPZMatrix<float> *)0x0) {
    bVar2 = false;
  }
  else {
    lVar1 = __dynamic_cast(A,&TPZMatrix<float>::typeinfo,&typeinfo,0);
    bVar2 = lVar1 != 0;
  }
  if (B == (TPZMatrix<float> *)0x0) {
    bVar3 = false;
  }
  else {
    lVar1 = __dynamic_cast(B,&TPZMatrix<float>::typeinfo,&typeinfo,0);
    bVar3 = lVar1 != 0;
  }
  if ((bool)(bVar2 & bVar3)) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZFMatrix<float>::CheckTypeCompatibility(const TPZMatrix<TVar> *, const TPZMatrix<TVar> *) const [TVar = float]"
             ,0x7d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: incompatible matrices.Aborting...\n",0x2a);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x1cb);
}

Assistant:

inline void CheckTypeCompatibility(const TPZMatrix<TVar>*A,
                                       const TPZMatrix<TVar>*B)const override
    {
        auto aPtr = dynamic_cast<const TPZFMatrix<TVar>*>(A);
        auto bPtr = dynamic_cast<const TPZFMatrix<TVar>*>(B);
        if(!aPtr || !bPtr){
            PZError<<__PRETTY_FUNCTION__;
            PZError<<"\nERROR: incompatible matrices.Aborting...\n";
            DebugStop();
        }
    }